

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(uint32 value,uint8 *target)

{
  byte *pbVar1;
  uint8 *target_local;
  uint32 value_local;
  byte *local_18;
  uint local_c;
  byte *local_8;
  
  if (value < 0x80) {
    *target = (byte)value;
    local_8 = target + 1;
  }
  else {
    *target = (byte)value | 0x80;
    local_c = value >> 7;
    if (local_c < 0x80) {
      target[1] = (uint8)local_c;
      local_8 = target + 2;
    }
    else {
      pbVar1 = target + 1;
      do {
        local_18 = pbVar1;
        *local_18 = (byte)local_c | 0x80;
        local_c = local_c >> 7;
        pbVar1 = local_18 + 1;
      } while (0x7f < local_c);
      local_8 = local_18 + 2;
      local_18[1] = (byte)local_c;
    }
  }
  return local_8;
}

Assistant:

inline uint8* CodedOutputStream::WriteVarint32ToArray(uint32 value,
                                                      uint8* target) {
  return EpsCopyOutputStream::UnsafeVarint(value, target);
}